

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O3

void __thiscall Regex::dumpElement(Regex *this,Element *cur_node,string *dump)

{
  char cVar1;
  char cVar2;
  ostream *poVar3;
  long *plVar4;
  long lVar5;
  char *pcVar6;
  stringstream strm;
  char local_1c8;
  undefined7 uStack_1c7;
  long local_1b8 [2];
  stringstream local_1a8 [16];
  long local_198 [3];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8,_S_out|_S_in);
  switch(cur_node->mType) {
  case TYPE_SEQUENCE:
    lVar5 = 3;
    pcVar6 = "[S]";
    poVar3 = (ostream *)local_198;
    goto LAB_0011d157;
  case TYPE_OR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[O]",3);
    if (cur_node->mRepeatMin == cur_node->mRepeatMax) goto LAB_0011d15c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,cur_node->mRepeatMin);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
    break;
  case TYPE_TERMINAL:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[T:",3);
    cVar1 = cur_node->mTermStartChar;
    cVar2 = cur_node->mTermEndChar;
    if (cVar1 == '\0') {
      if (cVar2 != '\0') {
        if (cVar2 == '\x7f') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".",1);
          goto LAB_0011d0e4;
        }
        goto LAB_0011d056;
      }
LAB_0011d097:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"0x",2);
      *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
           *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
      plVar4 = (long *)std::ostream::operator<<((ostream *)local_198,(int)cur_node->mTermStartChar);
      *(uint *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x18) =
           *(uint *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
    }
    else if (cVar1 == cVar2) {
      if (cVar1 < ' ') goto LAB_0011d097;
      local_1c8 = cVar1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1c8,1);
    }
    else {
LAB_0011d056:
      local_1c8 = cVar1;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1c8,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-",1);
      local_1c8 = cur_node->mTermEndChar;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1c8,1);
    }
LAB_0011d0e4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"]",1);
    if (cur_node->mRepeatMin == cur_node->mRepeatMax) goto LAB_0011d15c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,cur_node->mRepeatMin);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
    break;
  case TYPE_CLASS:
    pcVar6 = "[C]";
    if ((ulong)cur_node->mClassInvert != 0) {
      pcVar6 = "[C^]";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,pcVar6,(ulong)cur_node->mClassInvert + 3);
    if ((cur_node->mRepeatMin == 1) && (cur_node->mRepeatMax == 1)) goto LAB_0011d15c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,cur_node->mRepeatMin);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
    break;
  default:
    jh_log_print(1,"void Regex::dumpElement(Element *, std::string &)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                 ,0x1dc,"Bad element Type");
    goto LAB_0011d15c;
  }
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,cur_node->mRepeatMax);
  lVar5 = 1;
  pcVar6 = "}";
LAB_0011d157:
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar5);
LAB_0011d15c:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)dump,CONCAT71(uStack_1c7,local_1c8));
  if ((long *)CONCAT71(uStack_1c7,local_1c8) != local_1b8) {
    operator_delete((long *)CONCAT71(uStack_1c7,local_1c8),local_1b8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void	Regex::dumpElement( Element *cur_node, std::string &dump )
{
	std::stringstream strm( std::stringstream::in | std::stringstream::out );
	
	switch ( cur_node->mType )
	{
		case TYPE_SEQUENCE:
			LOG_INFO( "Seq" );
			strm << "[S]";
			break;
			
		case TYPE_OR:
			LOG_INFO( "Or" );
			strm << "[O]";
			if ( cur_node->mRepeatMin != cur_node->mRepeatMax )
				strm << "{" << cur_node->mRepeatMin << "," << cur_node->mRepeatMax << "}";
			break;

		case TYPE_TERMINAL:
			LOG_INFO( "Terminal" );
			strm << "[T:";
			if ( cur_node->mTermStartChar == 0 && cur_node->mTermEndChar == 127 )
				strm << ".";
			else if ( cur_node->mTermStartChar == cur_node->mTermEndChar )
			{
				if ( cur_node->mTermStartChar < ' ' )
					strm << "0x" << std::hex << (int)cur_node->mTermStartChar << std::dec;
				else
					strm << cur_node->mTermStartChar;
			}
			else
			{
				strm << cur_node->mTermStartChar << "-" << cur_node->mTermEndChar;
			}
			strm << "]";

			if ( cur_node->mRepeatMin != cur_node->mRepeatMax )
				strm << "{" << cur_node->mRepeatMin << "," << cur_node->mRepeatMax << "}";
			break;

		case TYPE_CLASS:
			LOG_INFO( "Class" );
			
			if ( cur_node->mClassInvert )
				strm << "[C^]";
			else
				strm << "[C]";
				
			if ( cur_node->mRepeatMin != 1 || cur_node->mRepeatMax != 1 )
				strm << "{" << cur_node->mRepeatMin << "," << cur_node->mRepeatMax << "}";
			break;
			
		default:
			LOG_ERR_FATAL( "Bad element Type" );
			break;
	}

	dump.append( strm.str() );
}